

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWGenerator.cxx
# Opt level: O0

string * __thiscall
cmCPackIFWGenerator::GetComponentInstallDirNameSuffix
          (string *__return_storage_ptr__,cmCPackIFWGenerator *this,string *componentName)

{
  mapped_type *component;
  string local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  undefined4 local_c4;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  allocator local_79;
  undefined1 local_78 [8];
  string suffix;
  allocator local_41;
  undefined1 local_40 [8];
  string prefix;
  string *componentName_local;
  cmCPackIFWGenerator *this_local;
  
  prefix.field_2._8_8_ = componentName;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_40,"packages/",&local_41);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_78,"/data",&local_79);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  if ((this->super_cmCPackGenerator).componentPackageMethod == ONE_PACKAGE) {
    GetRootPackageName_abi_cxx11_(&local_c0,this);
    std::operator+(&local_a0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                   &local_c0);
    std::operator+(__return_storage_ptr__,&local_a0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_c0);
  }
  else {
    component = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>_>
                ::operator[](&(this->super_cmCPackGenerator).Components,
                             (key_type *)prefix.field_2._8_8_);
    GetComponentPackageName_abi_cxx11_(&local_108,this,component);
    std::operator+(&local_e8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                   &local_108);
    std::operator+(__return_storage_ptr__,&local_e8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_108);
  }
  local_c4 = 1;
  std::__cxx11::string::~string((string *)local_78);
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCPackIFWGenerator::GetComponentInstallDirNameSuffix(
  const std::string& componentName)
{
  const std::string prefix = "packages/";
  const std::string suffix = "/data";

  if (this->componentPackageMethod == this->ONE_PACKAGE) {
    return std::string(prefix + this->GetRootPackageName() + suffix);
  }

  return prefix +
    this->GetComponentPackageName(&this->Components[componentName]) + suffix;
}